

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>>,boost::integer_range<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
          *lhs,char *op,integer_range<int> *rhs)

{
  integer_range<int> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>>>
            (&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  doctest::operator+(&local_30,&local_48,&local_60);
  toStream<boost::integer_range<int>>(&SStack_78,(detail *)op,in);
  doctest::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }